

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void gam_LocationF(int proc,Integer g_handle,Integer *subscript,char **ptr_loc,Integer *ld)

{
  int iVar1;
  C_Integer *pCVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Integer _d;
  ushort uVar8;
  int iVar9;
  C_Integer CVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  global_array_t *pgVar15;
  Integer _lo [7];
  Integer _hi [7];
  int _index [7];
  
  uVar8 = GA[g_handle].ndim;
  lVar14 = (long)(short)uVar8;
  iVar9 = GA[g_handle].distr_type;
  if (iVar9 - 1U < 3) {
    lVar6 = (long)proc % GA[g_handle].num_blocks[0];
    _index[0] = (int)lVar6;
    uVar3 = (ulong)(uint)proc;
    lVar12 = 0;
    while (lVar12 + 1 < lVar14) {
      uVar3 = (long)((int)uVar3 - (int)lVar6) / GA[g_handle].num_blocks[lVar12];
      lVar6 = (long)(int)uVar3 % GA[g_handle].num_blocks[lVar12 + 1];
      _index[lVar12 + 1] = (int)lVar6;
      lVar12 = lVar12 + 1;
    }
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (short)uVar8) {
      uVar4 = uVar8;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar9 = _index[uVar3];
      lVar12 = GA[g_handle].block_dims[uVar3];
      _lo[uVar3] = lVar12 * iVar9 + 1;
      lVar12 = ((long)iVar9 + 1) * lVar12;
      if (GA[g_handle].dims[uVar3] <= lVar12) {
        lVar12 = GA[g_handle].dims[uVar3];
      }
      _hi[uVar3] = lVar12;
    }
  }
  else if (iVar9 == 4) {
    lVar6 = (long)proc % GA[g_handle].num_blocks[0];
    _index[0] = (int)lVar6;
    uVar3 = (ulong)(uint)proc;
    lVar12 = 0;
    while (lVar12 + 1 < lVar14) {
      uVar3 = (long)((int)uVar3 - (int)lVar6) / GA[g_handle].num_blocks[lVar12];
      lVar6 = (long)(int)uVar3 % GA[g_handle].num_blocks[lVar12 + 1];
      _index[lVar12 + 1] = (int)lVar6;
      lVar12 = lVar12 + 1;
    }
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (short)uVar8) {
      uVar4 = uVar8;
    }
    iVar9 = 0;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pCVar2 = GA[g_handle].mapc;
      iVar1 = _index[uVar3];
      lVar6 = (long)iVar9 + (long)iVar1;
      _lo[uVar3] = pCVar2[lVar6];
      lVar12 = GA[g_handle].num_blocks[uVar3];
      if ((long)iVar1 < lVar12 + -1) {
        CVar10 = pCVar2[lVar6 + 1] + -1;
      }
      else {
        CVar10 = GA[g_handle].dims[uVar3];
      }
      _hi[uVar3] = CVar10;
      iVar9 = iVar9 + (int)lVar12;
    }
  }
  else if (iVar9 == 0) {
    if (GA[g_handle].num_rstrctd == 0) {
      lVar6 = 0;
      lVar12 = 0;
      if (0 < lVar14) {
        lVar12 = lVar14;
      }
      lVar5 = 1;
      for (; lVar12 != lVar6; lVar6 = lVar6 + 1) {
        lVar5 = lVar5 * GA[g_handle].nblock[lVar6];
      }
      if ((proc < 0) || (lVar5 <= proc)) {
        for (lVar6 = 0; lVar12 != lVar6; lVar6 = lVar6 + 1) {
          _lo[lVar6] = 0;
          _hi[lVar6] = -1;
        }
      }
      else {
        lVar7 = 0;
        lVar6 = (long)proc;
        for (lVar5 = 0; lVar12 * 4 != lVar5; lVar5 = lVar5 + 4) {
          lVar13 = (long)*(int *)((long)GA[g_handle].nblock + lVar5);
          lVar11 = lVar6 % lVar13;
          pCVar2 = GA[g_handle].mapc;
          *(C_Integer *)((long)_lo + lVar5 * 2) = pCVar2[lVar11 + lVar7];
          if (lVar11 == lVar13 + -1) {
            lVar11 = *(long *)((long)GA[g_handle].dims + lVar5 * 2);
          }
          else {
            lVar11 = pCVar2[lVar11 + lVar7 + 1] + -1;
          }
          lVar7 = lVar7 + lVar13;
          *(long *)((long)_hi + lVar5 * 2) = lVar11;
          lVar6 = lVar6 / lVar13;
        }
      }
    }
    else {
      lVar12 = (long)proc;
      if (lVar12 < GA[g_handle].num_rstrctd) {
        lVar6 = 1;
        lVar7 = 0;
        lVar5 = 0;
        if (0 < lVar14) {
          lVar5 = lVar14;
        }
        for (; lVar5 != lVar7; lVar7 = lVar7 + 1) {
          lVar6 = lVar6 * GA[g_handle].nblock[lVar7];
        }
        if ((proc < 0) || (lVar6 <= lVar12)) {
          for (lVar12 = 0; lVar5 != lVar12; lVar12 = lVar12 + 1) {
            _lo[lVar12] = 0;
            _hi[lVar12] = -1;
          }
        }
        else {
          lVar7 = 0;
          for (lVar6 = 0; lVar5 * 4 != lVar6; lVar6 = lVar6 + 4) {
            lVar13 = (long)*(int *)((long)GA[g_handle].nblock + lVar6);
            lVar11 = lVar12 % lVar13;
            pCVar2 = GA[g_handle].mapc;
            *(C_Integer *)((long)_lo + lVar6 * 2) = pCVar2[lVar11 + lVar7];
            if (lVar11 == lVar13 + -1) {
              lVar11 = *(long *)((long)GA[g_handle].dims + lVar6 * 2);
            }
            else {
              lVar11 = pCVar2[lVar11 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar13;
            *(long *)((long)_hi + lVar6 * 2) = lVar11;
            lVar12 = lVar12 / lVar13;
          }
        }
      }
      else {
        uVar3 = 0;
        uVar4 = 0;
        if (0 < (short)uVar8) {
          uVar4 = uVar8;
        }
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          _lo[uVar3] = 0;
          _hi[uVar3] = -1;
        }
      }
    }
  }
  lVar12 = lVar14 + -1;
  pgVar15 = GA;
  for (lVar6 = 0; lVar6 < (short)uVar8; lVar6 = lVar6 + 1) {
    if (_hi[lVar6] < subscript[lVar6] || subscript[lVar6] < _lo[lVar6]) {
      sprintf((char *)_index,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error((char *)_index,lVar6);
      uVar8 = GA[g_handle].ndim;
      pgVar15 = GA;
    }
  }
  if (lVar12 == 0) {
    *ld = (_hi[0] - _lo[0]) + pgVar15[g_handle].width[0] * 2 + 1;
  }
  lVar6 = 0;
  if (lVar12 < 1) {
    lVar12 = lVar6;
  }
  lVar5 = 1;
  lVar7 = 0;
  for (; lVar12 != lVar6; lVar6 = lVar6 + 1) {
    lVar11 = ((pgVar15[g_handle].width[lVar6] * 2 + 1) - _lo[lVar6]) + _hi[lVar6];
    lVar7 = lVar7 + ((pgVar15[g_handle].width[lVar6] + subscript[lVar6]) - _lo[lVar6]) * lVar5;
    ld[lVar6] = lVar11;
    lVar5 = lVar5 * lVar11;
  }
  if (pgVar15[g_handle].p_handle == 0) {
    CVar10 = (C_Integer)PGRP_LIST->inv_map_proc_list[proc];
  }
  else if (pgVar15[g_handle].num_rstrctd == 0) {
    CVar10 = (C_Integer)proc;
  }
  else {
    CVar10 = pgVar15[g_handle].rstrctd_list[proc];
  }
  *ptr_loc = pgVar15[g_handle].ptr[CVar10] +
             (long)pgVar15[g_handle].elemsize *
             (((subscript[lVar14 + -1] - _lo[lVar14 + -1]) + pgVar15[g_handle].width[lVar14 + -1]) *
              lVar5 + lVar7);
  return;
}

Assistant:

void gam_LocationF(int proc, Integer g_handle,  Integer subscript[],
    char **ptr_loc, Integer ld[])
{                                                                          
  Integer _offset=0, _d, _w, _factor=1, _last=GA[g_handle].ndim-1;         
  Integer _lo[MAXDIM], _hi[MAXDIM], _pinv, _p_handle;                     
                                                                           
  ga_ownsM(g_handle, proc, _lo, _hi);                                      
  gaCheckSubscriptM(subscript, _lo, _hi, GA[g_handle].ndim);               
  if(_last==0) ld[0]=_hi[0]- _lo[0]+1+2*(Integer)GA[g_handle].width[0];   
  for(_d=0; _d < _last; _d++)            {                                 
    _w = (Integer)GA[g_handle].width[_d];                                  
    _offset += (subscript[_d]-_lo[_d]+_w) * _factor;                       
    ld[_d] = _hi[_d] - _lo[_d] + 1 + 2*_w;                                 
    _factor *= ld[_d];                                                     
  }                                                                        
  _offset += (subscript[_last]-_lo[_last]                                  
      + (Integer)GA[g_handle].width[_last])                                
  * _factor;                                                               
  _p_handle = GA[g_handle].p_handle;                                       
  if (_p_handle != 0) {                                                    
    if (GA[g_handle].num_rstrctd == 0) {                                   
      _pinv = proc;                                                        
    } else {                                                               
      _pinv = GA[g_handle].rstrctd_list[proc];                             
    }                                                                      
  } else {                                                                 
    _pinv = PGRP_LIST[_p_handle].inv_map_proc_list[proc];                  
  }                                                                       
  *(ptr_loc) =  GA[g_handle].ptr[_pinv]+_offset*GA[g_handle].elemsize;    
}